

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpSocketImpl::ConnectThread(TcpSocketImpl *this)

{
  BaseSocket *pBVar1;
  bool bVar2;
  int iVar3;
  memory_order mVar4;
  long lVar5;
  atomic_uchar *this_00;
  TcpSocket *local_210;
  uchar cExpected;
  TcpSocket *pTcpSocket;
  code *local_1b8;
  undefined8 local_1b0;
  thread local_1a8;
  TcpSocketImpl *local_1a0;
  code *local_198;
  undefined8 local_190;
  thread local_188;
  socklen_t local_17c;
  __suseconds_t *p_Stack_178;
  socklen_t iLen;
  fd_set *__arr_1;
  __fd_mask *p_Stack_168;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_158 [4];
  uint __i;
  timeval timeout;
  fd_set errorfd;
  fd_set writefd;
  TcpSocketImpl *this_local;
  bool local_26;
  
  std::__atomic_base<unsigned_char>::operator&=
            (&(this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>,0xfb)
  ;
  do {
    do {
      if (((this->super_BaseSocketImpl).m_bStop & 1U) != 0) goto LAB_00130b7e;
      memset(errorfd.fds_bits + 0xf,0,0x80);
      memset(&timeout.tv_usec,0,0x80);
      memset(auStack_158,0,0x10);
      _auStack_158 = 2;
      timeout.tv_sec = 0;
      p_Stack_168 = errorfd.fds_bits + 0xf;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        p_Stack_168[__arr._4_4_] = 0;
      }
      p_Stack_178 = &timeout.tv_usec;
      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
        p_Stack_178[__arr_1._4_4_] = 0;
      }
      lVar5 = (long)((this->super_BaseSocketImpl).m_fSock / 0x40);
      errorfd.fds_bits[lVar5 + 0xf] =
           1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f) |
           errorfd.fds_bits[lVar5 + 0xf];
      lVar5 = (long)((this->super_BaseSocketImpl).m_fSock / 0x40);
      errorfd.fds_bits[lVar5 + -1] =
           1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f) |
           errorfd.fds_bits[lVar5 + -1];
      iVar3 = select((this->super_BaseSocketImpl).m_fSock + 1,(fd_set *)0x0,
                     (fd_set *)(errorfd.fds_bits + 0xf),(fd_set *)&timeout.tv_usec,
                     (timeval *)auStack_158);
    } while ((iVar3 < 1) || (((this->super_BaseSocketImpl).m_bStop & 1U) != 0));
    if ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + -1] &
        1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) != 0) {
      local_17c = 4;
      getsockopt((this->super_BaseSocketImpl).m_fSock,1,4,&(this->super_BaseSocketImpl).m_iError,
                 &local_17c);
      (this->super_BaseSocketImpl).m_iErrLoc = 9;
      std::__atomic_base<unsigned_char>::operator=
                (&(this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>,
                 '\x0f');
      bVar2 = std::function::operator_cast_to_bool
                        ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
      if ((bVar2) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
        std::function<void_(BaseSocket_*,_void_*)>::operator()
                  (&(this->super_BaseSocketImpl).m_fErrorParam,(this->super_BaseSocketImpl).m_pBkRef
                   ,(this->super_BaseSocketImpl).m_pvUserData);
      }
      else {
        bVar2 = std::function::operator_cast_to_bool
                          ((function *)&(this->super_BaseSocketImpl).m_fError);
        if ((bVar2) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
          std::function<void_(BaseSocket_*)>::operator()
                    (&(this->super_BaseSocketImpl).m_fError,(this->super_BaseSocketImpl).m_pBkRef);
        }
      }
      goto LAB_00130b7e;
    }
  } while ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + 0xf] &
           1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) == 0);
  GetConnectionInfo(this);
  local_198 = SelectThread;
  local_190 = 0;
  local_1a0 = this;
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_188,(type *)&local_198,&local_1a0);
  std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,&local_188);
  std::thread::~thread(&local_188);
  local_1b8 = WriteThread;
  local_1b0 = 0;
  pTcpSocket = (TcpSocket *)this;
  std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
            (&local_1a8,(type *)&local_1b8,(TcpSocketImpl **)&pTcpSocket);
  std::thread::operator=(&(this->super_BaseSocketImpl).m_thWrite,&local_1a8);
  std::thread::~thread(&local_1a8);
  pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    local_210 = (TcpSocket *)0x0;
  }
  else {
    local_210 = (TcpSocket *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
  }
  bVar2 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnectedParam);
  if ((bVar2) && (local_210 != (TcpSocket *)0x0)) {
    std::function<void_(TcpSocket_*,_void_*)>::operator()
              (&this->m_fClientConnectedParam,local_210,(this->super_BaseSocketImpl).m_pvUserData);
  }
  else {
    bVar2 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnected);
    if ((bVar2) && (local_210 != (TcpSocket *)0x0)) {
      std::function<void_(TcpSocket_*)>::operator()(&this->m_fClientConnected,local_210);
    }
  }
  bVar2 = std::function::operator_cast_to_bool((function *)&this->m_fClientConnectedSsl);
  if (bVar2) {
    std::function<void_(TcpSocketImpl_*)>::operator()
              (&this->m_fClientConnectedSsl,(TcpSocketImpl *)0x0);
  }
LAB_00130b7e:
  this_00 = &(this->super_BaseSocketImpl).m_iShutDownState;
  std::__atomic_base<unsigned_char>::operator|=(&this_00->super___atomic_base<unsigned_char>,'\x04')
  ;
  mVar4 = std::__cmpexch_failure_order(memory_order_seq_cst);
  switch(0x130d05) {
  default:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 2:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 3:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    break;
  case 4:
    if (mVar4 - memory_order_consume < 2) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else if (mVar4 == memory_order_seq_cst) {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
    else {
      LOCK();
      local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
      if (local_26) {
        (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
      }
      UNLOCK();
    }
  }
  if (local_26) {
    if ((this->super_BaseSocketImpl).m_fSock != -1) {
      close((this->super_BaseSocketImpl).m_fSock);
      (this->super_BaseSocketImpl).m_fSock = -1;
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])();
    if ((this->m_bSelfDelete & 1U) == 1) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])();
    }
  }
  return;
}

Assistant:

void TcpSocketImpl::ConnectThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~4);

    while (m_bStop == false)
    {
        fd_set writefd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&writefd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &writefd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) > 0 && m_bStop == false)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 9;
                m_iShutDownState = 15;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &writefd))
            {
                GetConnectionInfo();

                m_thListen = thread(&TcpSocketImpl::SelectThread, this);
                m_thWrite = thread(&TcpSocketImpl::WriteThread, this);

                TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                if (m_fClientConnectedParam && pTcpSocket != nullptr)
                    m_fClientConnectedParam(pTcpSocket, m_pvUserData);
                else if (m_fClientConnected && pTcpSocket != nullptr)
                    m_fClientConnected(pTcpSocket);

                if (m_fClientConnectedSsl)
                    m_fClientConnectedSsl(nullptr);
                break;
            }
        }
    }

    m_iShutDownState |= 4;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }

        StartClosingCB();

        if (m_bSelfDelete == true)    // Auto-delete, socket created from server socket
            Delete();// thread([&]() { delete this; }).detach();
    }
}